

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void __thiscall
HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator>::HashTable
          (HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator> *this,
          JitArenaAllocator *allocator,uint tableSize)

{
  char *name;
  DictionaryStats *pDVar1;
  uint tableSize_local;
  JitArenaAllocator *allocator_local;
  HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator> *this_local;
  
  this->alloc = allocator;
  this->tableSize = tableSize;
  Init(this);
  name = std::type_info::name
                   ((type_info *)
                    &HashTable<FrameDisplayCheckRecord*,Memory::JitArenaAllocator>*::typeinfo);
  pDVar1 = DictionaryStats::Create(name,tableSize);
  this->stats = pDVar1;
  return;
}

Assistant:

HashTable(TAllocator * allocator, DECLSPEC_GUARD_OVERFLOW uint tableSize) : alloc(allocator), tableSize(tableSize)
    {
        Init();
#if PROFILE_DICTIONARY
        stats = DictionaryStats::Create(typeid(this).name(), tableSize);
#endif
    }